

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex.c
# Opt level: O0

int hex_decode(char *in_buf,uint in_size,void *out_buf,uint out_size)

{
  char *pcVar1;
  uchar *out_end;
  uchar *out;
  char *in_end;
  char *in;
  uint out_size_local;
  void *out_buf_local;
  uint in_size_local;
  char *in_buf_local;
  uint local_4;
  
  if (out_buf == (void *)0x0) {
    local_4 = in_size >> 1;
  }
  else if ((in_size & 1) == 0) {
    if (out_size < in_size >> 1) {
      local_4 = 0xffffffff;
    }
    else {
      out = (uchar *)out_buf;
      for (in = in_buf; in < in_buf + in_size && out < (uchar *)((long)out_buf + (ulong)out_size);
          in = in + 2) {
        if ((*in < '0') || ('9' < *in)) {
          if ((*in < 'a') || ('z' < *in)) {
            if ((*in < 'A') || ('Z' < *in)) {
              return -1;
            }
            *out = (*in + -0x37) * '\x10';
          }
          else {
            *out = (*in + -0x57) * '\x10';
          }
        }
        else {
          *out = *in * '\x10';
        }
        pcVar1 = in + 1;
        if ((*pcVar1 < '0') || ('9' < *pcVar1)) {
          if ((*pcVar1 < 'a') || ('z' < *pcVar1)) {
            if ((*pcVar1 < 'A') || ('Z' < *pcVar1)) {
              return -1;
            }
            *out = *out | *pcVar1 - 0x37U;
          }
          else {
            *out = *out | *pcVar1 + 0xa9U;
          }
        }
        else {
          *out = *out | *pcVar1 - 0x30U;
        }
        out = out + 1;
      }
      local_4 = (int)out - (int)out_buf;
    }
  }
  else {
    local_4 = 0xffffffff;
  }
  return local_4;
}

Assistant:

int
hex_decode(const char* in_buf, unsigned in_size, void* out_buf, unsigned out_size)
{
    const char* in = in_buf;
    const char* in_end = in + in_size;
    unsigned char* out = (unsigned char*) out_buf;
    unsigned char* out_end = out + out_size;

    if(out_buf == NULL)
        return in_size / 2;

    if(in_size % 2 != 0)
        return -1;
    if(out_size < in_size / 2)
        return -1;

    in = in_buf;
    in_end = in + in_size;
    out = (unsigned char*) out_buf;
    out_end = out + out_size;

    while(in < in_end  &&  out < out_end) {
        if('0' <= *in  &&  *in <= '9')
            *out = (*in - '0') << 4;
        else if('a' <= *in  &&  *in <= 'z')
            *out = (*in - 'a' + 10) << 4;
        else if('A' <= *in  &&  *in <= 'Z')
            *out = (*in - 'A' + 10) << 4;
        else
            return -1;
        in++;

        if('0' <= *in  &&  *in <= '9')
            *out |= (*in - '0');
        else if('a' <= *in  &&  *in <= 'z')
            *out |= (*in - 'a' + 10);
        else if('A' <= *in  &&  *in <= 'Z')
            *out |= (*in - 'A' + 10);
        else
            return -1;
        in++;

        out++;
    }

    return out - (const unsigned char*) out_buf;
}